

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall
Parser::Parser(Parser *this,ScriptContext *scriptContext,BOOL strictMode,PageAllocator *alloc,
              bool isBackground,size_t size)

{
  code *pcVar1;
  bool bVar2;
  TempGuestArenaAllocatorObject *ptr;
  TempArenaAllocatorWrapper<true> *pTVar3;
  undefined4 *puVar4;
  
  if (alloc == (PageAllocator *)0x0) {
    alloc = &(scriptContext->threadContext->pageAllocator).super_PageAllocator;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,L"Parser",
             alloc,OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  *(undefined1 (*) [16])((long)&this->m_nextFunctionId + 1) = (undefined1  [16])0x0;
  this->m_originalLength = 0;
  this->m_nextFunctionId = (LocalFunctionId *)0x0;
  this->m_cactIdentToNodeLookup = 0;
  this->m_grfscr = 0;
  this->m_length = 0;
  this->m_isInBackground = isBackground;
  this->m_doingFastScan = false;
  this->m_tempGuestArenaReleased = false;
  this->m_nextBlockId = 0;
  ptr = Js::ScriptContext::GetTemporaryGuestAllocator(scriptContext,L"ParserRegex");
  Memory::AutoRecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>::AutoRecyclerRootPtr
            (&this->m_tempGuestArena,ptr,scriptContext->recycler);
  pTVar3 = Memory::RecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>::operator->
                     (&(this->m_tempGuestArena).
                       super_RecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>);
  (this->m_registeredRegexPatterns).
  super_SListBase<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->m_registeredRegexPatterns;
  (this->m_registeredRegexPatterns).
  super_SListBase<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.
  count = 0;
  (this->m_registeredRegexPatterns).allocator = &pTVar3->allocator;
  this->m_scriptContext = scriptContext;
  (this->m_token).tk = tkLim;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scanner(&this->m_scan,this,&this->m_token,scriptContext);
  this->m_currDeferredStubCount = 0;
  this->m_currentNodeProg = (ParseNodeProg *)0x0;
  this->m_currDeferredStub = (DeferredFunctionStub *)0x0;
  this->m_currentNodeFunc = (ParseNodeFnc *)0x0;
  this->m_currentNodeDeferredFunc = (ParseNodeFnc *)0x0;
  this->m_currentNodeNonLambdaFunc = (ParseNodeFnc *)0x0;
  this->m_currentNodeNonLambdaDeferredFunc = (ParseNodeFnc *)0x0;
  memset(&this->m_pCurrentAstSize,0,0xe4);
  this->m_functionBody = (ParseableFunctionInfo *)0x0;
  this->m_parseType = ParseType_Upfront;
  this->m_arrayDepth = 0;
  this->m_funcInArrayDepth = 0;
  this->m_funcInArray = 0;
  this->m_scopeCountNoAst = 0;
  this->m_funcParenExprDepth = 0;
  (this->m_deferEllipsisErrorLoc).m_ichMinTok = 0xffffffff;
  (this->m_deferEllipsisErrorLoc).m_ichMinLine = 0xffffffff;
  *(undefined4 *)&(this->m_deferEllipsisErrorLoc).m_cMinTokMultiUnits = 0xffffffff;
  *(undefined4 *)((long)&(this->m_deferEllipsisErrorLoc).m_cMinTokMultiUnits + 4) = 0xffffffff;
  *(undefined4 *)((long)&(this->m_deferEllipsisErrorLoc).m_cMinTokMultiUnits + 4) = 0xffffffff;
  *(undefined4 *)&(this->m_deferEllipsisErrorLoc).m_cMinLineMultiUnits = 0xffffffff;
  *(undefined4 *)((long)&(this->m_deferEllipsisErrorLoc).m_cMinLineMultiUnits + 4) = 0xffffffff;
  (this->m_deferEllipsisErrorLoc).m_line = 0xffffffff;
  *(undefined8 *)&(this->m_deferEllipsisErrorLoc).functionIdIncrement = 0;
  *(undefined8 *)((long)&(this->m_deferEllipsisErrorLoc).lengthDecr + 4) = 0;
  *(undefined4 *)&(this->m_deferEllipsisErrorLoc).m_cMultiUnits = 0xffffffff;
  *(undefined4 *)((long)&(this->m_deferEllipsisErrorLoc).m_cMultiUnits + 4) = 0xffffffff;
  (this->m_deferCommaErrorLoc).m_ichMinTok = 0xffffffff;
  (this->m_deferCommaErrorLoc).m_ichMinLine = 0xffffffff;
  *(undefined4 *)&(this->m_deferCommaErrorLoc).m_cMinTokMultiUnits = 0xffffffff;
  *(undefined4 *)((long)&(this->m_deferCommaErrorLoc).m_cMinTokMultiUnits + 4) = 0xffffffff;
  *(undefined4 *)&(this->m_deferCommaErrorLoc).m_cMinLineMultiUnits = 0xffffffff;
  *(undefined4 *)((long)&(this->m_deferCommaErrorLoc).m_cMinLineMultiUnits + 4) = 0xffffffff;
  (this->m_deferCommaErrorLoc).m_line = 0xffffffff;
  *(undefined8 *)&(this->m_deferCommaErrorLoc).functionIdIncrement = 0;
  *(undefined8 *)((long)&(this->m_deferCommaErrorLoc).lengthDecr + 4) = 0;
  (this->m_deferCommaErrorLoc).m_cMultiUnits = 0xffffffffffffffff;
  this->m_tryCatchOrFinallyDepth = 0;
  this->m_pstmtCur = (StmtNest *)0x0;
  this->m_currentBlockInfo = (BlockInfoStack *)0x0;
  this->m_currentScope = (Scope *)0x0;
  this->currBackgroundParseItem = (BackgroundParseItem *)0x0;
  this->backgroundParseItems = (BackgroundParseItem *)0x0;
  this->fastScannedRegExpNodes = (NodeDList *)0x0;
  *(undefined8 *)((long)&this->fastScannedRegExpNodes + 1) = 0;
  *(undefined8 *)((long)&this->m_currentDynamicBlock + 1) = 0;
  this->m_fUseStrictMode = strictMode;
  this->m_InAsmMode = false;
  this->m_deferAsmJs = true;
  this->m_fExpectExternalSource = 0;
  this->m_deferringAST = 0;
  this->m_stoppedDeferredParse = 0;
  if (size != 0xaa8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x7a,"(size == sizeof(Parser))",
                       "verify conditionals affecting the size of Parser agree");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  InitPids(this);
  return;
}

Assistant:

Parser::Parser(Js::ScriptContext* scriptContext, BOOL strictMode, PageAllocator *alloc, bool isBackground)
#endif
    : m_nodeAllocator(_u("Parser"), alloc ? alloc : scriptContext->GetThreadContext()->GetPageAllocator(), Parser::OutOfMemory),
    m_cactIdentToNodeLookup(0),
    m_grfscr(fscrNil),
    m_length(0),
    m_originalLength(0),
    m_nextFunctionId(nullptr),
    m_sourceContextInfo(nullptr),
#if ENABLE_BACKGROUND_PARSING
    m_isInBackground(isBackground),
    m_hasParallelJob(false),
    m_doingFastScan(false),
#endif
    m_nextBlockId(0),
    m_tempGuestArenaReleased(false),
    m_tempGuestArena(scriptContext->GetTemporaryGuestAllocator(_u("ParserRegex")), scriptContext->GetRecycler()),
    // use the GuestArena directly for keeping the RegexPattern* alive during byte code generation
    m_registeredRegexPatterns(m_tempGuestArena->GetAllocator()),

    m_scriptContext(scriptContext),
    m_token(), // should initialize to 0/nullptrs
    m_scan(this, &m_token, scriptContext),

    m_currentNodeNonLambdaFunc(nullptr),
    m_currentNodeNonLambdaDeferredFunc(nullptr),
    m_currentNodeFunc(nullptr),
    m_currentNodeDeferredFunc(nullptr),
    m_currentNodeProg(nullptr),
    m_currDeferredStub(nullptr),
    m_currDeferredStubCount(0),
    m_pCurrentAstSize(nullptr),
    m_ppnodeScope(nullptr),
    m_ppnodeExprScope(nullptr),
    m_ppnodeVar(nullptr),
    m_inDeferredNestedFunc(false),
    m_reparsingLambdaParams(false),
    m_disallowImportExportStmt(false),
    m_isInParsingArgList(false),
    m_hasDestructuringPattern(false),
    m_hasDeferredShorthandInitError(false),
    m_deferCommaError(false),
    m_pnestedCount(nullptr),

    wellKnownPropertyPids(), // should initialize to nullptrs
    m_sourceLim(0),
    m_functionBody(nullptr),
    m_parseType(ParseType_Upfront),

    m_arrayDepth(0),
    m_funcInArrayDepth(0),
    m_funcInArray(0),
    m_scopeCountNoAst(0),

    m_funcParenExprDepth(0),
    m_deferEllipsisError(false),
    m_deferEllipsisErrorLoc(), // calls default initializer
    m_deferCommaErrorLoc(),
    m_tryCatchOrFinallyDepth(0),

    m_pstmtCur(nullptr),
    m_currentBlockInfo(nullptr),
    m_currentScope(nullptr),

    currBackgroundParseItem(nullptr),
    backgroundParseItems(nullptr),
    fastScannedRegExpNodes(nullptr),

    m_currentDynamicBlock(nullptr),

    m_UsesArgumentsAtGlobal(false),

    m_fUseStrictMode(strictMode),
    m_InAsmMode(false),
    m_deferAsmJs(true),
    m_fExpectExternalSource(FALSE),
    m_deferringAST(FALSE),
    m_stoppedDeferredParse(FALSE)
{
    AssertMsg(size == sizeof(Parser), "verify conditionals affecting the size of Parser agree");
    Assert(scriptContext != nullptr);

    // init PID members
    InitPids();
}